

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O3

EC_T_DWORD
DoBusScan(EC_T_DWORD dwInstanceID,CAtEmLogging *poLog,EC_T_SB_STATUS_NTFY_DESC *poStatus,
         EC_T_BOOL bWait,EC_T_BOOL bNtfyActive,EC_T_DWORD dwScanBustimeout)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  EC_T_DWORD dwNumOutData;
  EC_T_IOCTLPARMS oIoCtlParms;
  CEcTimer oTimeout;
  EC_T_DWORD local_84;
  CAtEmLogging *local_80;
  undefined1 local_74 [4];
  EC_T_DWORD *local_70;
  undefined4 local_68;
  EC_T_SB_STATUS_NTFY_DESC *local_64;
  undefined4 local_5c;
  undefined1 *local_58;
  CEcTimer local_50 [32];
  
  local_84 = dwScanBustimeout;
  CEcTimer::CEcTimer(local_50);
  local_68 = 4;
  local_64 = (EC_T_SB_STATUS_NTFY_DESC *)0x0;
  local_5c = 0;
  local_70 = &local_84;
  local_58 = local_74;
  uVar1 = emIoControl(dwInstanceID,0x50007);
  if (uVar1 == 0) {
    local_80 = poLog;
    CEcTimer::Start(local_50,local_84);
    iVar2 = CEcTimer::IsElapsed(local_50);
    uVar3 = 0;
    if (iVar2 == 0) {
      do {
        uVar3 = emIoControl(dwInstanceID,0x50001,0);
        if (uVar3 == 0x98110008) {
          LinuxSleep(10);
          uVar3 = 0x98110008;
        }
        else {
          if (uVar3 != 0) {
            CAtEmLogging::LogError
                      (local_80,"DoBusScan(): Error 0x%x when restarting bus scan",(ulong)uVar3);
            break;
          }
          iVar2 = CEcTimer::IsElapsed(local_50);
          uVar3 = 0;
          while (iVar2 == 0) {
            LinuxSleep(10);
            local_70 = (EC_T_DWORD *)0x0;
            local_68 = 0;
            local_5c = 8;
            local_64 = poStatus;
            local_58 = local_74;
            uVar3 = emIoControl(dwInstanceID,0x50002,&local_70);
            if (uVar3 != 0) {
              CAtEmLogging::LogError
                        (local_80,"DoBusScan(): Error 0x%x getting the Bus scan status",(ulong)uVar3
                        );
              break;
            }
            uVar3 = poStatus->dwResultCode;
            iVar2 = CEcTimer::IsElapsed(local_50);
            if ((bWait == 0) || (1 < uVar3 + 0x67eefff9)) goto LAB_0014abd2;
          }
        }
        iVar2 = CEcTimer::IsElapsed(local_50);
      } while (iVar2 == 0);
    }
LAB_0014abd2:
    iVar2 = CEcTimer::IsElapsed(local_50);
    uVar1 = 0x98110010;
    if (iVar2 == 0) {
      uVar1 = uVar3;
    }
  }
  else {
    CAtEmLogging::LogError
              (poLog,"Scan Bus feature could not be enabled! (Result = 0x%x)",(ulong)uVar1);
  }
  return uVar1;
}

Assistant:

EC_T_DWORD DoBusScan
    (EC_T_DWORD                dwInstanceID
    ,CAtEmLogging*             poLog
    ,EC_T_SB_STATUS_NTFY_DESC* poStatus           /**< [out]  bus scan status */
    ,EC_T_BOOL                 bWait              /**< [in]   EC_TRUE if call shall block until the scan is finish */
    ,EC_T_BOOL                 bNtfyActive        /**< [in]   EC_TRUE if notifications are active */
    ,EC_T_DWORD                dwScanBustimeout)  /**< [in]   Timeout value in msec */
{
    EC_T_DWORD dwRes = EC_E_NOERROR;
    CEcTimer   oTimeout;
    EC_T_BOOL  bReady = EC_FALSE;

    EC_UNREFPARM(bNtfyActive);

    /* set timeout */
    dwRes = emIoCtl(dwInstanceID, EC_IOCTL_SB_ENABLE, &dwScanBustimeout, sizeof(EC_T_DWORD), EC_NULL, 0, EC_NULL);
    if (EC_E_NOERROR != dwRes)
    {
        LogErr( "Scan Bus feature could not be enabled! (Result = 0x%x)", dwRes);
        goto Exit;
    }

    oTimeout.Start(dwScanBustimeout);
    while (!oTimeout.IsElapsed() && !bReady)
    {
        dwRes = emIoControl(dwInstanceID, EC_IOCTL_SB_RESTART, EC_NULL);
        if (EC_E_BUSY == dwRes)
        {
            OsSleep(10);
        }
        else if (EC_E_NOERROR != dwRes)
        {
            LogErr("DoBusScan(): Error 0x%x when restarting bus scan", dwRes);
            break;
        }
        else
        {
            while (!oTimeout.IsElapsed())
            {
                OsSleep(10);
                dwRes = emIoCtl(dwInstanceID, EC_IOCTL_SB_STATUS_GET, EC_NULL, 0, poStatus, sizeof(EC_T_SB_STATUS_NTFY_DESC), EC_NULL);
                if (dwRes != EC_E_NOERROR)
                {
                    LogErr("DoBusScan(): Error 0x%x getting the Bus scan status", dwRes);
                    break;
                }
                dwRes = poStatus->dwResultCode;
                if (!bWait || ((dwRes != EC_E_BUSY) && (dwRes != EC_E_NOTREADY)))
                {
                    bReady = EC_TRUE;
                    break;
                }
            }
        }
    }

    if (oTimeout.IsElapsed())
    {
        dwRes = EC_E_TIMEOUT;
    }
Exit:
    return dwRes;
}